

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O2

int get_number(char *prompt)

{
  int iVar1;
  int i;
  char line [80];
  
  printf("%s",prompt);
  iVar1 = 0;
  while (iVar1 != 1) {
    iVar1 = __isoc99_scanf("%d",&i);
    fgets(line,0x50,_stdin);
  }
  return i;
}

Assistant:

int get_number(char *prompt)
{
    char line[STRING_MAX];
    int n = 0, i;
    printf("%s", prompt);
    while (n != 1) {
        n = scanf("%d", &i);
        fgets(line, STRING_MAX, stdin);
    }
    return i;
}